

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdflib.c
# Opt level: O3

FT_Error bdf_list_split_(bdf_list_t_ *list,char *separators,char *line,unsigned_long linelen)

{
  bool bVar1;
  FT_Error FVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  byte bVar5;
  byte *pbVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  char *pcVar10;
  byte *pbVar11;
  char seps [32];
  byte local_58 [40];
  
  list->used = 0;
  uVar4 = list->size;
  if (uVar4 != 0) {
    *list->field = "";
    list->field[1] = "";
    list->field[2] = "";
    list->field[3] = "";
    list->field[4] = "";
  }
  if (linelen == 0) {
    return 0;
  }
  bVar5 = *line;
  if (bVar5 == 0) {
    return 0;
  }
  if (separators == (char *)0x0) {
    return 6;
  }
  bVar7 = *separators;
  if (bVar7 == 0) {
    return 6;
  }
  local_58[0x10] = 0;
  local_58[0x11] = 0;
  local_58[0x12] = 0;
  local_58[0x13] = 0;
  local_58[0x14] = 0;
  local_58[0x15] = 0;
  local_58[0x16] = 0;
  local_58[0x17] = 0;
  local_58[0x18] = 0;
  local_58[0x19] = 0;
  local_58[0x1a] = 0;
  local_58[0x1b] = 0;
  local_58[0x1c] = 0;
  local_58[0x1d] = 0;
  local_58[0x1e] = 0;
  local_58[0x1f] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0;
  pbVar6 = (byte *)(separators + 1);
  bVar1 = false;
  do {
    if (bVar7 == 0x2b) {
      bVar8 = *pbVar6;
      if (bVar8 != 0) goto LAB_0021ce0a;
      bVar1 = true;
      bVar7 = 0;
    }
    else {
      if (bVar7 == 0) goto LAB_0021ce2b;
      bVar8 = *pbVar6;
LAB_0021ce0a:
      local_58[bVar7 >> 3] = local_58[bVar7 >> 3] | '\x01' << (bVar7 & 7);
      bVar7 = bVar8;
    }
    pbVar6 = pbVar6 + 1;
  } while( true );
LAB_0021cf03:
  uVar4 = list->size;
  uVar3 = list->used;
  goto LAB_0021cf12;
LAB_0021ce2b:
  if (0 < (long)linelen) {
    pbVar6 = (byte *)(line + linelen);
    pcVar10 = line;
LAB_0021ce41:
    do {
      if ((local_58[bVar5 >> 3] >> (bVar5 & 7) & 1) == 0) {
        bVar5 = ((byte *)line)[1];
        line = (char *)((byte *)line + 1);
        if (bVar5 != 0) goto LAB_0021ce41;
      }
      uVar4 = list->used;
      if (uVar4 == list->size) {
        FVar2 = bdf_list_ensure_(list,uVar4 + 1);
        if (FVar2 != 0) {
          return FVar2;
        }
        uVar4 = list->used;
      }
      if (line <= pcVar10) {
        pcVar10 = "";
      }
      list->used = uVar4 + 1;
      list->field[uVar4] = pcVar10;
      bVar5 = *line;
      pbVar11 = (byte *)line;
      if (bVar1) {
        if (bVar5 == 0) {
LAB_0021ceee:
          bVar5 = 0;
        }
        else {
          do {
            if ((local_58[bVar5 >> 3] >> (bVar5 & 7) & 1) == 0) goto LAB_0021cecb;
            *pbVar11 = 0;
            bVar5 = pbVar11[1];
            pbVar11 = pbVar11 + 1;
          } while (bVar5 != 0);
          bVar5 = 0;
LAB_0021cecb:
          if (line < pbVar11) goto LAB_0021cee3;
        }
        uVar9 = 0;
        line = (char *)pbVar11;
      }
      else {
        if (bVar5 == 0) goto LAB_0021ceee;
        pbVar11 = (byte *)line + 1;
        *line = 0;
        bVar5 = ((byte *)line)[1];
LAB_0021cee3:
        uVar9 = (ulong)(bVar5 == 0);
        line = (char *)pbVar11;
      }
      if ((pbVar6 <= line) || (pcVar10 = line, bVar5 == 0)) goto LAB_0021cf03;
    } while( true );
  }
  uVar3 = 0;
  uVar9 = 0;
LAB_0021cf12:
  if (uVar4 <= uVar3 + uVar9) {
    FVar2 = bdf_list_ensure_(list,uVar3 + uVar9 + 1);
    if (FVar2 != 0) {
      return FVar2;
    }
    uVar3 = list->used;
  }
  uVar4 = uVar3;
  if (uVar9 != 0) {
    uVar4 = uVar3 + 1;
    list->used = uVar4;
    list->field[uVar3] = "";
  }
  list->field[uVar4] = (char *)0x0;
  return 0;
}

Assistant:

static FT_Error
  bdf_list_split_( bdf_list_t_*   list,
                   const char*    separators,
                   char*          line,
                   unsigned long  linelen )
  {
    unsigned long  final_empty;
    int            mult;
    const char     *sp, *end;
    char           *ep;
    char           seps[32];
    FT_Error       error = FT_Err_Ok;


    /* Initialize the list. */
    list->used = 0;
    if ( list->size )
    {
      list->field[0] = (char*)empty;
      list->field[1] = (char*)empty;
      list->field[2] = (char*)empty;
      list->field[3] = (char*)empty;
      list->field[4] = (char*)empty;
    }

    /* If the line is empty, then simply return. */
    if ( linelen == 0 || line[0] == 0 )
      goto Exit;

    /* In the original code, if the `separators' parameter is NULL or */
    /* empty, the list is split into individual bytes.  We don't need */
    /* this, so an error is signaled.                                 */
    if ( separators == NULL || *separators == 0 )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* Prepare the separator bitmap. */
    FT_MEM_ZERO( seps, 32 );

    /* If the very last character of the separator string is a plus, then */
    /* set the `mult' flag to indicate that multiple separators should be */
    /* collapsed into one.                                                */
    for ( mult = 0, sp = separators; sp && *sp; sp++ )
    {
      if ( *sp == '+' && *( sp + 1 ) == 0 )
        mult = 1;
      else
        setsbit( seps, *sp );
    }

    /* Break the line up into fields. */
    for ( final_empty = 0, sp = ep = line, end = sp + linelen;
          sp < end && *sp; )
    {
      /* Collect everything that is not a separator. */
      for ( ; *ep && !sbitset( seps, *ep ); ep++ )
        ;

      /* Resize the list if necessary. */
      if ( list->used == list->size )
      {
        error = bdf_list_ensure_( list, list->used + 1 );
        if ( error )
          goto Exit;
      }

      /* Assign the field appropriately. */
      list->field[list->used++] = ( ep > sp ) ? (char*)sp : (char*)empty;

      sp = ep;

      if ( mult )
      {
        /* If multiple separators should be collapsed, do it now by */
        /* setting all the separator characters to 0.               */
        for ( ; *ep && sbitset( seps, *ep ); ep++ )
          *ep = 0;
      }
      else if ( *ep != 0 )
        /* Don't collapse multiple separators by making them 0, so just */
        /* make the one encountered 0.                                  */
        *ep++ = 0;

      final_empty = ( ep > sp && *ep == 0 );
      sp = ep;
    }

    /* Finally, NULL-terminate the list. */
    if ( list->used + final_empty >= list->size )
    {
      error = bdf_list_ensure_( list, list->used + final_empty + 1 );
      if ( error )
        goto Exit;
    }

    if ( final_empty )
      list->field[list->used++] = (char*)empty;

    list->field[list->used] = NULL;

  Exit:
    return error;
  }